

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_ni.c
# Opt level: O0

void libyang_verbclb(LY_LOG_LEVEL level,char *msg,char *path)

{
  char *local_28;
  char *levstr;
  char *path_local;
  char *msg_local;
  LY_LOG_LEVEL level_local;
  
  if (level <= verbose) {
    if (level == LY_LLERR) {
      local_28 = "err :";
    }
    else if (level == LY_LLWRN) {
      local_28 = "warn:";
    }
    else if (level == LY_LLVRB) {
      local_28 = "verb:";
    }
    else {
      local_28 = "dbg :";
    }
    if (path == (char *)0x0) {
      fprintf(_stderr,"%s %s\n",local_28,msg);
    }
    else {
      fprintf(_stderr,"%s %s (%s)\n",local_28,msg,path);
    }
  }
  return;
}

Assistant:

void
libyang_verbclb(LY_LOG_LEVEL level, const char *msg, const char *path)
{
    char *levstr;

    if (level <= verbose) {
        switch(level) {
        case LY_LLERR:
            levstr = "err :";
            break;
        case LY_LLWRN:
            levstr = "warn:";
            break;
        case LY_LLVRB:
            levstr = "verb:";
            break;
        default:
            levstr = "dbg :";
            break;
        }
        if (path) {
            fprintf(stderr, "%s %s (%s)\n", levstr, msg, path);
        } else {
            fprintf(stderr, "%s %s\n", levstr, msg);
        }
    }
}